

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharCharacterIterator::move(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  int iVar1;
  int iVar2;
  
  if (origin == kStart) {
    iVar2 = delta + (this->super_CharacterIterator).begin;
  }
  else if (origin == kCurrent) {
    iVar2 = delta + (this->super_CharacterIterator).pos;
  }
  else {
    if (origin != kEnd) {
      iVar2 = (this->super_CharacterIterator).pos;
      goto LAB_002ae18f;
    }
    iVar2 = delta + (this->super_CharacterIterator).end;
  }
  (this->super_CharacterIterator).pos = iVar2;
LAB_002ae18f:
  iVar1 = (this->super_CharacterIterator).begin;
  if ((iVar2 < iVar1) || (iVar1 = (this->super_CharacterIterator).end, iVar1 < iVar2)) {
    iVar2 = iVar1;
    (this->super_CharacterIterator).pos = iVar2;
  }
  return iVar2;
}

Assistant:

int32_t
UCharCharacterIterator::move(int32_t delta, CharacterIterator::EOrigin origin) {
    switch(origin) {
    case kStart:
        pos = begin + delta;
        break;
    case kCurrent:
        pos += delta;
        break;
    case kEnd:
        pos = end + delta;
        break;
    default:
        break;
    }

    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }

    return pos;
}